

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

EventControlWithExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EventControlWithExpressionSyntax,slang::syntax::EventControlWithExpressionSyntax_const&>
          (BumpAllocator *this,EventControlWithExpressionSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  EventExpressionSyntax *pEVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  SyntaxKind SVar8;
  undefined4 uVar9;
  EventControlWithExpressionSyntax *pEVar10;
  
  pEVar10 = (EventControlWithExpressionSyntax *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((EventControlWithExpressionSyntax *)this->endPtr < pEVar10 + 1) {
    pEVar10 = (EventControlWithExpressionSyntax *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pEVar10 + 1);
  }
  SVar8 = (args->super_TimingControlSyntax).super_SyntaxNode.kind;
  uVar9 = *(undefined4 *)&(args->super_TimingControlSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_TimingControlSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_TimingControlSyntax).super_SyntaxNode.previewNode;
  TVar4 = (args->at).kind;
  uVar5 = (args->at).field_0x2;
  NVar6.raw = (args->at).numFlags.raw;
  uVar7 = (args->at).rawLen;
  pEVar3 = (args->expr).ptr;
  (pEVar10->at).info = (args->at).info;
  (pEVar10->expr).ptr = pEVar3;
  (pEVar10->super_TimingControlSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pEVar10->at).kind = TVar4;
  (pEVar10->at).field_0x2 = uVar5;
  (pEVar10->at).numFlags = (NumericTokenFlags)NVar6.raw;
  (pEVar10->at).rawLen = uVar7;
  (pEVar10->super_TimingControlSyntax).super_SyntaxNode.kind = SVar8;
  *(undefined4 *)&(pEVar10->super_TimingControlSyntax).super_SyntaxNode.field_0x4 = uVar9;
  (pEVar10->super_TimingControlSyntax).super_SyntaxNode.parent = pSVar1;
  return pEVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }